

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O0

int acutest_check_(int cond,char *file,int line,char *fmt,...)

{
  char *in_RCX;
  uint in_EDX;
  char *in_RSI;
  int in_EDI;
  va_list args;
  int verbose_level;
  int result_color;
  char *result_str;
  undefined1 auStack_f8 [8];
  undefined4 in_stack_ffffffffffffff10;
  acutest_state_ in_stack_ffffffffffffff14;
  undefined4 local_48;
  undefined4 local_44;
  undefined1 *local_40;
  undefined1 *local_38;
  int local_30;
  uint local_2c;
  char *local_28;
  char *local_20;
  uint local_14;
  char *local_10;
  int local_4;
  
  if (acutest_test_skip_count_ == 0) {
    local_20 = in_RCX;
    local_14 = in_EDX;
    local_10 = in_RSI;
    local_4 = in_EDI;
    if (in_EDI == 0) {
      if ((acutest_test_already_logged_ == 0) && (acutest_current_test_ != (acutest_test_ *)0x0)) {
        acutest_finish_test_line_(in_stack_ffffffffffffff14);
      }
      acutest_test_failures_ = acutest_test_failures_ + 1;
      acutest_test_already_logged_ = acutest_test_already_logged_ + 1;
      local_28 = "failed";
      local_2c = 1;
      local_30 = 2;
    }
    else {
      local_28 = "ok";
      local_2c = 2;
      local_30 = 3;
    }
    if (local_30 <= acutest_verbose_level_) {
      if ((acutest_case_already_logged_ == 0) && (acutest_case_name_[0] != '\0')) {
        acutest_line_indent_(0);
        acutest_colored_printf_(10,"Case %s:\n",acutest_case_name_);
        acutest_test_already_logged_ = acutest_test_already_logged_ + 1;
        acutest_case_already_logged_ = acutest_case_already_logged_ + 1;
      }
      acutest_line_indent_(0);
      if (local_10 != (char *)0x0) {
        local_10 = acutest_basename_((char *)CONCAT44(in_stack_ffffffffffffff14,
                                                      in_stack_ffffffffffffff10));
        printf("%s:%d: ",local_10,(ulong)local_14);
      }
      local_40 = &stack0x00000008;
      local_44 = 0x30;
      local_48 = 0x20;
      local_38 = auStack_f8;
      vprintf(local_20,&local_48);
      printf("... ");
      acutest_colored_printf_((int)(ulong)local_2c,"%s",local_28);
      printf("\n");
      acutest_test_already_logged_ = acutest_test_already_logged_ + 1;
    }
    acutest_test_check_count_ = acutest_test_check_count_ + 1;
  }
  else {
    local_4 = 1;
  }
  acutest_cond_failed_ = (uint)(local_4 == 0);
  return (int)((local_4 == 0) == 0);
}

Assistant:

acutest_check_(int cond, const char* file, int line, const char* fmt, ...)
{
    const char *result_str;
    int result_color;
    int verbose_level;

    if(acutest_test_skip_count_) {
        /* We've skipped the test. We shouldn't be here: The test implementation
         * should have already return before. So lets suppress the following
         * output. */
        cond = 1;
        goto skip_check;
    }

    if(cond) {
        result_str = "ok";
        result_color = ACUTEST_COLOR_GREEN_;
        verbose_level = 3;
    } else {
        if(!acutest_test_already_logged_  &&  acutest_current_test_ != NULL)
            acutest_finish_test_line_(ACUTEST_STATE_FAILED);

        acutest_test_failures_++;
        acutest_test_already_logged_++;

        result_str = "failed";
        result_color = ACUTEST_COLOR_RED_;
        verbose_level = 2;
    }

    if(acutest_verbose_level_ >= verbose_level) {
        va_list args;

        if(!acutest_case_already_logged_  &&  acutest_case_name_[0]) {
            acutest_line_indent_(1);
            acutest_colored_printf_(ACUTEST_COLOR_DEFAULT_INTENSIVE_, "Case %s:\n", acutest_case_name_);
            acutest_test_already_logged_++;
            acutest_case_already_logged_++;
        }

        acutest_line_indent_(acutest_case_name_[0] ? 2 : 1);
        if(file != NULL) {
            file = acutest_basename_(file);
            printf("%s:%d: ", file, line);
        }

        va_start(args, fmt);
        vprintf(fmt, args);
        va_end(args);

        printf("... ");
        acutest_colored_printf_(result_color, "%s", result_str);
        printf("\n");
        acutest_test_already_logged_++;
    }

    acutest_test_check_count_++;

skip_check:
    acutest_cond_failed_ = (cond == 0);
    return !acutest_cond_failed_;
}